

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O2

void WebPBlendAlpha(WebPPicture *picture,uint32_t background_rgb)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint32_t *puVar7;
  uint8_t *puVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint8_t *puVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint8_t *__s;
  uint8_t *puVar18;
  
  if (picture != (WebPPicture *)0x0) {
    uVar2 = background_rgb >> 0x10 & 0xff;
    uVar4 = background_rgb >> 8 & 0xff;
    uVar9 = background_rgb & 0xff;
    if (picture->use_argb == 0) {
      __s = picture->a;
      if ((__s != (uint8_t *)0x0 & (byte)(char)picture->colorspace >> 2) == 1) {
        uVar14 = uVar4 * -0x12a24 + 0x2020000 + uVar9 * 0x1c200 + uVar2 * -0x97dc >> 0x12;
        uVar11 = uVar4 * -0x178d0 + 0x2020000 + uVar9 * -0x4930 + uVar2 * 0x1c200 >> 0x12;
        uVar15 = picture->width >> 1;
        puVar18 = picture->v;
        puVar13 = picture->u;
        puVar8 = picture->y;
        uVar17 = 0;
        if ((int)uVar15 < 1) {
          uVar15 = uVar17;
        }
        uVar16 = (ulong)uVar15;
        for (; (int)uVar17 < picture->height; uVar17 = uVar17 + 1) {
          for (lVar12 = 0; uVar15 = picture->width, lVar12 < (int)uVar15; lVar12 = lVar12 + 1) {
            bVar1 = __s[lVar12];
            if (bVar1 != 0xff) {
              puVar8[lVar12] =
                   (uint8_t)(((uint)puVar8[lVar12] * (uint)bVar1 +
                             (bVar1 ^ 0xff) *
                             (uVar9 * 0x1914 + uVar2 * 0x41c7 + uVar4 * 0x8123 + 0x108000 >> 0x10))
                             * 0x101 + 0x100 >> 0x10);
            }
          }
          if ((uVar17 & 1) == 0) {
            puVar3 = __s;
            if ((uVar17 | 1) != picture->height) {
              puVar3 = __s + picture->a_stride;
            }
            for (uVar6 = 0; uVar16 != uVar6; uVar6 = uVar6 + 1) {
              iVar10 = (uint)puVar3[uVar6 * 2 + 1] + (uint)puVar3[uVar6 * 2] +
                       (uint)__s[uVar6 * 2 + 1] + (uint)__s[uVar6 * 2];
              puVar13[uVar6] =
                   (uint8_t)(((uint)puVar13[uVar6] * iVar10 + (0x3fc - iVar10) * uVar14) * 0x101 +
                             0x400 >> 0x12);
              puVar18[uVar6] =
                   (uint8_t)(((uint)puVar18[uVar6] * iVar10 + (0x3fc - iVar10) * uVar11) * 0x101 +
                             0x400 >> 0x12);
            }
            uVar15 = picture->width;
            if ((uVar15 & 1) != 0) {
              iVar10 = ((uint)puVar3[uVar16 * 2] + (uint)__s[uVar16 * 2]) * 2;
              iVar5 = ((uint)puVar3[uVar16 * 2] + (uint)__s[uVar16 * 2]) * -2 + 0x3fc;
              puVar13[uVar16] =
                   (uint8_t)(((uint)puVar13[uVar16] * iVar10 + iVar5 * uVar14) * 0x101 + 0x400 >>
                            0x12);
              puVar18[uVar16] =
                   (uint8_t)(((uint)puVar18[uVar16] * iVar10 + iVar5 * uVar11) * 0x101 + 0x400 >>
                            0x12);
              uVar15 = picture->width;
            }
          }
          else {
            puVar13 = puVar13 + picture->uv_stride;
            puVar18 = puVar18 + picture->uv_stride;
          }
          memset(__s,0xff,(long)(int)uVar15);
          __s = __s + picture->a_stride;
          puVar8 = puVar8 + picture->y_stride;
        }
      }
    }
    else {
      puVar7 = picture->argb;
      for (iVar10 = 0; iVar10 < picture->height; iVar10 = iVar10 + 1) {
        for (lVar12 = 0; lVar12 < picture->width; lVar12 = lVar12 + 1) {
          uVar15 = puVar7[lVar12];
          uVar17 = uVar15 >> 0x18;
          if (uVar17 != 0xff) {
            uVar14 = uVar4 << 8 | uVar2 << 0x10 | uVar9;
            if (0xffffff < uVar15) {
              uVar14 = uVar17 ^ 0xff;
              uVar14 = ((uVar15 >> 8 & 0xff) * uVar17 + uVar14 * uVar4) * 0x101 + 0x100 >> 8 &
                       0xffff00 |
                       ((uVar15 & 0xff) * uVar17 + uVar14 * uVar9) * 0x101 + 0x100 >> 0x10 |
                       ((uVar15 >> 0x10 & 0xff) * uVar17 + uVar14 * uVar2) * 0x101 + 0x100 &
                       0xff0000;
            }
            puVar7[lVar12] = uVar14 | 0xff000000;
          }
        }
        puVar7 = puVar7 + picture->argb_stride;
      }
    }
  }
  return;
}

Assistant:

void WebPBlendAlpha(WebPPicture* picture, uint32_t background_rgb) {
  const int red = (background_rgb >> 16) & 0xff;
  const int green = (background_rgb >> 8) & 0xff;
  const int blue = (background_rgb >> 0) & 0xff;
  int x, y;
  if (picture == NULL) return;
  if (!picture->use_argb) {
    // omit last pixel during u/v loop
    const int uv_width = (picture->width >> 1);
    const int Y0 = VP8RGBToY(red, green, blue, YUV_HALF);
    // VP8RGBToU/V expects the u/v values summed over four pixels
    const int U0 = VP8RGBToU(4 * red, 4 * green, 4 * blue, 4 * YUV_HALF);
    const int V0 = VP8RGBToV(4 * red, 4 * green, 4 * blue, 4 * YUV_HALF);
    const int has_alpha = picture->colorspace & WEBP_CSP_ALPHA_BIT;
    uint8_t* y_ptr = picture->y;
    uint8_t* u_ptr = picture->u;
    uint8_t* v_ptr = picture->v;
    uint8_t* a_ptr = picture->a;
    if (!has_alpha || a_ptr == NULL) return;    // nothing to do
    for (y = 0; y < picture->height; ++y) {
      // Luma blending
      for (x = 0; x < picture->width; ++x) {
        const uint8_t alpha = a_ptr[x];
        if (alpha < 0xff) {
          y_ptr[x] = BLEND(Y0, y_ptr[x], alpha);
        }
      }
      // Chroma blending every even line
      if ((y & 1) == 0) {
        uint8_t* const a_ptr2 =
            (y + 1 == picture->height) ? a_ptr : a_ptr + picture->a_stride;
        for (x = 0; x < uv_width; ++x) {
          // Average four alpha values into a single blending weight.
          // TODO(skal): might lead to visible contouring. Can we do better?
          const uint32_t alpha =
              a_ptr[2 * x + 0] + a_ptr[2 * x + 1] +
              a_ptr2[2 * x + 0] + a_ptr2[2 * x + 1];
          u_ptr[x] = BLEND_10BIT(U0, u_ptr[x], alpha);
          v_ptr[x] = BLEND_10BIT(V0, v_ptr[x], alpha);
        }
        if (picture->width & 1) {  // rightmost pixel
          const uint32_t alpha = 2 * (a_ptr[2 * x + 0] + a_ptr2[2 * x + 0]);
          u_ptr[x] = BLEND_10BIT(U0, u_ptr[x], alpha);
          v_ptr[x] = BLEND_10BIT(V0, v_ptr[x], alpha);
        }
      } else {
        u_ptr += picture->uv_stride;
        v_ptr += picture->uv_stride;
      }
      memset(a_ptr, 0xff, picture->width);  // reset alpha value to opaque
      a_ptr += picture->a_stride;
      y_ptr += picture->y_stride;
    }
  } else {
    uint32_t* argb = picture->argb;
    const uint32_t background = MakeARGB32(red, green, blue);
    for (y = 0; y < picture->height; ++y) {
      for (x = 0; x < picture->width; ++x) {
        const int alpha = (argb[x] >> 24) & 0xff;
        if (alpha != 0xff) {
          if (alpha > 0) {
            int r = (argb[x] >> 16) & 0xff;
            int g = (argb[x] >>  8) & 0xff;
            int b = (argb[x] >>  0) & 0xff;
            r = BLEND(red, r, alpha);
            g = BLEND(green, g, alpha);
            b = BLEND(blue, b, alpha);
            argb[x] = MakeARGB32(r, g, b);
          } else {
            argb[x] = background;
          }
        }
      }
      argb += picture->argb_stride;
    }
  }
}